

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O0

QAMList * __thiscall
OSTEI_VRR_Algorithm_Base::GenerateAMReq
          (OSTEI_VRR_Algorithm_Base *this,QAM *am,RRStepType rrstep,bool all)

{
  bool bVar1;
  int *piVar2;
  undefined4 in_ECX;
  QAMList *in_RDI;
  byte in_R8B;
  QAM *it;
  iterator __end2;
  iterator __begin2;
  QAMList *__range2;
  QAMList req;
  QAMList *req2;
  undefined4 in_stack_fffffffffffff2b8;
  int in_stack_fffffffffffff2bc;
  uint in_stack_fffffffffffff2c0;
  int in_stack_fffffffffffff2c4;
  value_type *in_stack_fffffffffffff2c8;
  undefined4 in_stack_fffffffffffff2d0;
  int in_stack_fffffffffffff2d4;
  __normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> local_738;
  undefined1 *local_730;
  undefined1 local_722;
  undefined1 local_721 [88];
  allocator local_6c9;
  string local_6c8 [87];
  allocator local_671;
  string local_670 [87];
  allocator local_619;
  string local_618 [87];
  allocator local_5c1;
  string local_5c0 [87];
  allocator local_569;
  string local_568 [87];
  allocator local_511;
  string local_510 [87];
  allocator local_4b9;
  string local_4b8 [87];
  allocator local_461;
  string local_460 [87];
  allocator local_409;
  string local_408 [87];
  allocator local_3b1;
  string local_3b0 [87];
  allocator local_359;
  string local_358 [87];
  allocator local_301;
  string local_300 [87];
  allocator local_2a9;
  string local_2a8 [87];
  allocator local_251;
  string local_250 [87];
  allocator local_1f9;
  string local_1f8 [87];
  allocator local_1a1;
  string local_1a0 [87];
  allocator local_149;
  string local_148 [87];
  allocator local_f1;
  string local_f0 [87];
  allocator local_99;
  string local_98 [96];
  undefined1 local_38 [27];
  byte local_1d;
  undefined4 local_1c;
  
  local_1d = in_R8B & 1;
  local_1c = in_ECX;
  std::vector<QAM,_std::allocator<QAM>_>::vector((vector<QAM,_std::allocator<QAM>_> *)0x11db2a);
  switch(local_1c) {
  case 0:
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"",&local_99);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11dc99);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"",&local_f1);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11ddf2);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"",&local_149);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11df4c);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"",&local_1a1);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11e0a6);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"",&local_1f9);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11e200);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    break;
  case 1:
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"",&local_251);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11e592);
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a8,"",&local_2a9);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11e6ec);
    std::__cxx11::string::~string(local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_300,"",&local_301);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11e845);
    std::__cxx11::string::~string(local_300);
    std::allocator<char>::~allocator((allocator<char> *)&local_301);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_358,"",&local_359);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11e99f);
    std::__cxx11::string::~string(local_358);
    std::allocator<char>::~allocator((allocator<char> *)&local_359);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b0,"",&local_3b1);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11eaf9);
    std::__cxx11::string::~string(local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    break;
  case 2:
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_408,"",&local_409);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11ee72);
    std::__cxx11::string::~string(local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_460,"",&local_461);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11efcb);
    std::__cxx11::string::~string(local_460);
    std::allocator<char>::~allocator((allocator<char> *)&local_461);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4b8,"",&local_4b9);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11f125);
    std::__cxx11::string::~string(local_4b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_510,"",&local_511);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11f27f);
    std::__cxx11::string::~string(local_510);
    std::allocator<char>::~allocator((allocator<char> *)&local_511);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_568,"",&local_569);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11f3d9);
    std::__cxx11::string::~string(local_568);
    std::allocator<char>::~allocator((allocator<char> *)&local_569);
    break;
  case 3:
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5c0,"",&local_5c1);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11f752);
    std::__cxx11::string::~string(local_5c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_618,"",&local_619);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11f8ac);
    std::__cxx11::string::~string(local_618);
    std::allocator<char>::~allocator((allocator<char> *)&local_619);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_670,"",&local_671);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11fa05);
    std::__cxx11::string::~string(local_670);
    std::allocator<char>::~allocator((allocator<char> *)&local_671);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6c8,"",&local_6c9);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11fb3b);
    std::__cxx11::string::~string(local_6c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                    in_stack_fffffffffffff2bc);
    piVar2 = QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                             in_stack_fffffffffffff2bc);
    in_stack_fffffffffffff2d4 = *piVar2;
    piVar2 = QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                             in_stack_fffffffffffff2bc);
    in_stack_fffffffffffff2c4 = *piVar2 + -1;
    in_stack_fffffffffffff2c8 = (value_type *)local_721;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_721 + 1),"",(allocator *)in_stack_fffffffffffff2c8);
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8,
             in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0,
             (string *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (value_type *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    QAM::~QAM((QAM *)0x11fc5f);
    std::__cxx11::string::~string((string *)(local_721 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_721);
  }
  if ((local_1d & 1) == 0) {
    local_722 = 0;
    std::vector<QAM,_std::allocator<QAM>_>::vector((vector<QAM,_std::allocator<QAM>_> *)0x11febd);
    local_730 = local_38;
    local_738._M_current =
         (QAM *)std::vector<QAM,_std::allocator<QAM>_>::begin
                          ((vector<QAM,_std::allocator<QAM>_> *)
                           CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    std::vector<QAM,_std::allocator<QAM>_>::end
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                              CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                              (__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                              CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8)), bVar1)
    {
      __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::operator*
                (&local_738);
      QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (QAM *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
      bVar1 = ValidQAM((QAM *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0));
      in_stack_fffffffffffff2c0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff2c0);
      QAM::~QAM((QAM *)0x11ff61);
      if ((in_stack_fffffffffffff2c0 & 0x1000000) != 0) {
        std::vector<QAM,_std::allocator<QAM>_>::push_back
                  ((vector<QAM,_std::allocator<QAM>_> *)
                   CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                   in_stack_fffffffffffff2c8);
      }
      __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::operator++
                (&local_738);
    }
    local_722 = 1;
  }
  else {
    std::vector<QAM,_std::allocator<QAM>_>::vector
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
               (vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector
            ((vector<QAM,_std::allocator<QAM>_> *)
             CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0));
  return in_RDI;
}

Assistant:

QAMList OSTEI_VRR_Algorithm_Base::GenerateAMReq(QAM am, RRStepType rrstep, bool all) const
{
    QAMList req;
    switch(rrstep)
    {
        case RRStepType::I:
            req.push_back({am[0]-1, am[1]  , am[2]  , am[3]  });
            req.push_back({am[0]-2, am[1]  , am[2]  , am[3]  });
            req.push_back({am[0]-1, am[1]-1, am[2]  , am[3]  });
            req.push_back({am[0]-1, am[1]  , am[2]-1, am[3]  });
            req.push_back({am[0]-1, am[1]  , am[2]  , am[3]-1});
            break;
        case RRStepType::J:
            req.push_back({am[0]  , am[1]-1, am[2]  , am[3]  });
            req.push_back({am[0]-1, am[1]-1, am[2]  , am[3]  });
            req.push_back({am[0]  , am[1]-2, am[2]  , am[3]  });
            req.push_back({am[0]  , am[1]-1, am[2]-1, am[3]  });
            req.push_back({am[0]  , am[1]-1, am[2]  , am[3]-1});
            break;
        case RRStepType::K:
            req.push_back({am[0]  , am[1]  , am[2]-1, am[3]  });
            req.push_back({am[0]  , am[1]  , am[2]-2, am[3]  });
            req.push_back({am[0]  , am[1]  , am[2]-1, am[3]-1});
            req.push_back({am[0]-1, am[1]  , am[2]-1, am[3]  });
            req.push_back({am[0]  , am[1]-1, am[2]-1, am[3]  });
            break;
        case RRStepType::L:
            req.push_back({am[0]  , am[1]  , am[2]  , am[3]-1});
            req.push_back({am[0]  , am[1]  , am[2]-1, am[3]-1});
            req.push_back({am[0]  , am[1]  , am[2]  , am[3]-2});
            req.push_back({am[0]-1, am[1]  , am[2]  , am[3]-1});
            req.push_back({am[0]  , am[1]-1, am[2]  , am[3]-1});
            break;
    }

    // remove invalid quartets
    if(!all)
    {
        QAMList req2;
        for(const auto & it : req)
        {
            if(ValidQAM(it))
                req2.push_back(it);
        }
        return req2;
    }
    else
        return req;
}